

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manufactured_solution.cc
# Opt level: O3

int main(void)

{
  SparseMatrix<double,_0,_int> *pSVar1;
  double *pdVar2;
  double *pdVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  DofHandler *pDVar5;
  StorageIndex *pSVar6;
  size_type sVar7;
  _Impl *p_Var8;
  StorageIndex *pSVar9;
  pointer pMVar10;
  pointer pMVar11;
  double *pdVar12;
  code *pcVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  pointer pMVar15;
  pointer pMVar16;
  Index IVar17;
  _func_int *p_Var18;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
  *pMVar19;
  Mesh *pMVar20;
  element_type *peVar21;
  double dVar22;
  Scalar SVar23;
  undefined8 uVar24;
  pointer pMVar25;
  undefined1 auVar26 [8];
  Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  SVar27;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var28;
  byte bVar29;
  RefElType RVar30;
  uint uVar31;
  int iVar32;
  dim_t dVar33;
  SrcEvaluatorType srcEvaluator_3;
  UniformFEDofHandler *this;
  undefined4 extraout_var;
  long *plVar35;
  undefined4 extraout_var_00;
  ostream *poVar36;
  pointer pPVar37;
  Index index;
  ulong uVar38;
  size_t sVar39;
  long extraout_RDX;
  ulong uVar40;
  long extraout_RDX_00;
  anon_class_1_0_00000001 *qr_selector;
  anon_class_1_0_00000001 *qr_selector_00;
  anon_class_1_0_00000001 *qr_selector_01;
  anon_class_1_0_00000001 *qr_selector_02;
  anon_class_1_0_00000001 *qr_selector_03;
  anon_class_1_0_00000001 *qr_selector_04;
  PointerType ptr;
  Scalar *pSVar41;
  long lVar42;
  long lVar43;
  ActualDstType actualDst_1;
  anon_class_1_0_00000001 *qr_selector_05;
  ActualDstType actualDst;
  ActualDstType actualDst_3;
  ActualDstType actualDst_2;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar44;
  initializer_list<std::pair<const_lf::base::RefEl,_unsigned_int>_> __l;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
  diff_v;
  path meshpath;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
  diff_v_modified;
  vector<ProblemSolution,_std::allocator<ProblemSolution>_> solutions;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
  velocity_scaled_modified;
  GmshReader reader;
  MeshFunctionVelocity<double,_double> velocity;
  shared_ptr<lf::uscalfe::FeSpaceLagrangeO1<double>_> fe_space;
  shared_ptr<lf::mesh::Mesh> mesh;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>
  velocity_exact;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver_modified;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver;
  uint local_7e4;
  MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
  local_7e0;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *local_7a8;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_7a0;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_788;
  undefined1 local_768 [32];
  _Impl *local_748;
  _Any_data local_738;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_728;
  pointer local_720;
  pointer local_710;
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  local_6f8;
  vector<ProblemSolution,_std::allocator<ProblemSolution>_> local_6e0;
  _Any_data local_6c8;
  code *local_6b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6b0;
  _Alloc_hider local_6a8;
  undefined1 local_698 [8];
  undefined1 local_690 [32];
  undefined1 local_670 [16];
  pointer local_660;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_638;
  _Any_data local_608;
  code *local_5f8;
  code *local_5f0;
  element_type *local_5e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5e0;
  MeshFunctionVelocity<double,_double> local_5d8;
  PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_5b8;
  MeshFunctionReturnType<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>_>
  local_5a0;
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *local_598;
  MeshFunctionReturnType<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>_>
  local_590;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>
  local_588;
  shared_ptr<const_lf::mesh::Mesh> local_578;
  shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> local_568;
  shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>_> local_558;
  shared_ptr<const_lf::mesh::Mesh> local_548;
  int *local_538;
  double local_530;
  double local_528;
  double local_520;
  string local_518;
  undefined1 local_4f8 [8];
  undefined8 uStack_4f0;
  undefined1 local_4e8 [8];
  code *local_4e0;
  undefined1 auStack_4d8 [560];
  undefined1 local_2a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  undefined1 local_288 [16];
  StorageIndex *local_278;
  pointer local_270;
  pointer local_268;
  vector<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>,_std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>_>_>
  local_1f8 [2];
  uint local_1c0;
  _Rb_tree<lf::base::RefEl,_std::pair<const_lf::base::RefEl,_unsigned_int>,_std::_Select1st<std::pair<const_lf::base::RefEl,_unsigned_int>_>,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
  local_60;
  _func_int **pp_Var34;
  
  std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::vector
            (&local_6e0,6,(allocator_type *)local_2a8);
  local_7a0.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_7a0.
                        super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  local_7a8 = (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
              &PTR_DimWorld_0049f768;
  do {
    std::filesystem::__cxx11::path::path<char[148],std::filesystem::__cxx11::path>
              ((path *)local_768,
               (char (*) [148])
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc"
               ,auto_format);
    std::filesystem::__cxx11::path::parent_path();
    concat<char_const(&)[5],unsigned_int&,char_const(&)[5]>
              ((string *)&local_7e0,(char (*) [5])"disk",(uint *)&local_7a0,(char (*) [5])".msh");
    std::filesystem::__cxx11::path::path((path *)local_690,(string *)&local_7e0,auto_format);
    std::filesystem::__cxx11::operator/((path *)local_2a8,(path *)local_4f8,(path *)local_690);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_768,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8);
    uVar24 = local_288._0_8_;
    p_Var8 = local_748;
    local_288._0_8_ = (_Impl *)0x0;
    local_748 = (_Impl *)uVar24;
    if (p_Var8 != (_Impl *)0x0) {
      std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                ((_Impl_deleter *)&local_748,p_Var8);
    }
    std::filesystem::__cxx11::path::clear((path *)local_2a8);
    std::filesystem::__cxx11::path::~path((path *)local_2a8);
    std::filesystem::__cxx11::path::~path((path *)local_690);
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_7e0._0_8_ !=
        &local_7e0.a_.grad_.fe_space_.
         super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount) {
      operator_delete((void *)local_7e0._0_8_,
                      (ulong)((long)local_7e0.a_.grad_.fe_space_.
                                    super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi + 1));
    }
    std::filesystem::__cxx11::path::~path((path *)local_4f8);
    local_698 = (undefined1  [8])operator_new(0x60);
    ((MeshFactory *)local_698)->_vptr_MeshFactory = (_func_int **)local_7a8;
    *(undefined4 *)&((MeshFactory *)((long)local_698 + 8))->_vptr_MeshFactory = 2;
    ((MeshFactory *)((long)local_698 + 0x10))->_vptr_MeshFactory = (_func_int **)0x0;
    ((MeshFactory *)((long)local_698 + 0x18))->_vptr_MeshFactory = (_func_int **)0x0;
    ((MeshFactory *)((long)local_698 + 0x20))->_vptr_MeshFactory = (_func_int **)0x0;
    ((MeshFactory *)((long)local_698 + 0x28))->_vptr_MeshFactory = (_func_int **)0x0;
    ((MeshFactory *)((long)local_698 + 0x30))->_vptr_MeshFactory = (_func_int **)0x0;
    ((MeshFactory *)((long)local_698 + 0x38))->_vptr_MeshFactory = (_func_int **)0x0;
    ((MeshFactory *)((long)local_698 + 0x40))->_vptr_MeshFactory = (_func_int **)0x0;
    ((MeshFactory *)((long)local_698 + 0x48))->_vptr_MeshFactory = (_func_int **)0x0;
    ((MeshFactory *)((long)local_698 + 0x50))->_vptr_MeshFactory = (_func_int **)0x0;
    *(undefined1 *)&((MeshFactory *)((long)local_698 + 0x58))->_vptr_MeshFactory = 1;
    local_2a8 = (undefined1  [8])&local_298;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2a8,local_768._0_8_,(pointer)(local_768._0_8_ + local_768._8_8_));
    lf::io::GmshReader::GmshReader
              ((GmshReader *)local_690,
               (unique_ptr<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_> *)
               local_698,(string *)local_2a8);
    if (local_2a8 != (undefined1  [8])&local_298) {
      operator_delete((void *)local_2a8,local_298._M_allocated_capacity + 1);
    }
    if ((_Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
        local_698 != (MeshFactory *)0x0) {
      (**(code **)(*(long *)local_698 + 0x38))();
    }
    pPVar37 = local_6e0.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_698 = (undefined1  [8])0x0;
    local_5d8.grad_.fe_space_.
    super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_690._0_8_;
    local_5d8.grad_.fe_space_.
    super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_690._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_690._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_690._8_8_ + 8) = *(_Atomic_word *)(local_690._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_690._8_8_ + 8) = *(_Atomic_word *)(local_690._8_8_ + 8) + 1;
      }
    }
    uVar40 = (ulong)local_7a0.
                    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start & 0xffffffff;
    local_6e0.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>._M_impl.
    super__Vector_impl_data._M_start[uVar40].mesh.
    super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_690._0_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_6e0.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar40].mesh.
                super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_5d8.grad_.fe_space_.
                super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    this = (UniformFEDofHandler *)operator_new(0xb8);
    SVar27 = (Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              )_local_4f8;
    local_548.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_5d8.grad_.fe_space_.
         super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_548.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = local_5d8.grad_.fe_space_.
           super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    if (local_5d8.grad_.fe_space_.
        super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_5d8.grad_.fe_space_.
         super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_5d8.grad_.fe_space_.
              super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_5d8.grad_.fe_space_.
         super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_5d8.grad_.fe_space_.
              super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_4f8[0] = true;
    local_4f8._4_4_ = NumericalIssue;
    uStack_4f0._1_7_ = SVar27.m_rhs._1_7_;
    uStack_4f0._0_1_ = true;
    uStack_4f0._4_4_ = 1;
    __l._M_len = 2;
    __l._M_array = (iterator)local_4f8;
    std::
    map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
    ::map((map<lf::base::RefEl,_unsigned_int,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
           *)&local_60,__l,(less<lf::base::RefEl> *)&local_7e0,
          (allocator_type *)local_738._M_pod_data);
    lf::assemble::UniformFEDofHandler::UniformFEDofHandler
              (this,&local_548,(dof_map_t *)&local_60,true);
    local_2a8 = (undefined1  [8])this;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<lf::assemble::UniformFEDofHandler*>(&_Stack_2a0,this);
    _Var28._M_pi = _Stack_2a0._M_pi;
    auVar26 = local_2a8;
    pPVar37 = pPVar37 + uVar40;
    local_2a8 = (undefined1  [8])0x0;
    _Stack_2a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var4 = (pPVar37->dofh).
             super___shared_ptr<const_lf::assemble::DofHandler,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (pPVar37->dofh).super___shared_ptr<const_lf::assemble::DofHandler,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)auVar26;
    (pPVar37->dofh).super___shared_ptr<const_lf::assemble::DofHandler,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var28._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    if (_Stack_2a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_2a0._M_pi);
    }
    std::
    _Rb_tree<lf::base::RefEl,_std::pair<const_lf::base::RefEl,_unsigned_int>,_std::_Select1st<std::pair<const_lf::base::RefEl,_unsigned_int>_>,_std::less<lf::base::RefEl>,_std::allocator<std::pair<const_lf::base::RefEl,_unsigned_int>_>_>
    ::~_Rb_tree(&local_60);
    if (local_548.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_548.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pDVar5 = (pPVar37->dofh).
             super___shared_ptr<const_lf::assemble::DofHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    _local_4f8 = (DenseStorage<int,__1,__1,_1,_0>)ZEXT816(0);
    local_4f8._0_4_ = 3;
    local_4e0 = std::
                _Function_handler<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc:145:14)>
                ::_M_invoke;
    local_4e8 = (undefined1  [8])
                std::
                _Function_handler<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc:145:14)>
                ::_M_manager;
    local_738._M_unused._M_object = (MatrixXd *)0x0;
    local_738._8_8_ = 0;
    local_720 = (pointer)std::
                         _Function_handler<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc:149:28)>
                         ::_M_invoke;
    local_728 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                std::
                _Function_handler<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc:149:28)>
                ::_M_manager;
    lf::quad::make_QuadRule((QuadRule *)local_2a8,(RefEl)0x3,10);
    projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow
              ((tuple<lf::assemble::COOMatrix<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               &local_7e0,&pPVar37->mesh,pDVar5,
               (function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
                *)local_4f8,
               (function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)> *)
               &local_738,1.0,(QuadRule *)local_2a8,false);
    free((void *)local_288._0_8_);
    free(_Stack_2a0._M_pi);
    if (local_728 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(code *)local_728)(&local_738,&local_738,3);
    }
    if (local_4e8 != (undefined1  [8])0x0) {
      (*(code *)local_4e8)
                ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                 local_4f8,
                 (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                 local_4f8,3);
    }
    lf::assemble::COOMatrix<double>::makeSparse
              ((SparseMatrix<double,_0,_int> *)local_2a8,
               (COOMatrix<double> *)
               &local_7e0.a_.grad_.fe_space_.
                super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    pSVar1 = &pPVar37->A;
    if (local_2a8[0] == true) {
      pSVar6 = (pPVar37->A).m_outerIndex;
      (pPVar37->A).m_outerIndex = (StorageIndex *)local_298._8_8_;
      sVar7 = (pPVar37->A).m_innerSize;
      (pPVar37->A).m_innerSize = local_298._M_allocated_capacity;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pPVar37->A).m_outerSize;
      (pPVar37->A).m_outerSize = (Index)_Stack_2a0._M_pi;
      p_Var8 = (_Impl *)(pPVar37->A).m_innerNonZeros;
      (pPVar37->A).m_innerNonZeros = (StorageIndex *)local_288._0_8_;
      pSVar41 = (pPVar37->A).m_data.m_values;
      (pPVar37->A).m_data.m_values = (Scalar *)local_288._8_8_;
      pSVar9 = (pPVar37->A).m_data.m_indices;
      (pPVar37->A).m_data.m_indices = local_278;
      pMVar10 = (pointer)(pPVar37->A).m_data.m_size;
      (pPVar37->A).m_data.m_size = (Index)local_270;
      pMVar11 = (pointer)(pPVar37->A).m_data.m_allocatedSize;
      (pPVar37->A).m_data.m_allocatedSize = (Index)local_268;
      _Stack_2a0._M_pi = p_Var4;
      local_298._M_allocated_capacity = sVar7;
      local_298._8_8_ = pSVar6;
      local_288._0_8_ = p_Var8;
      local_288._8_8_ = pSVar41;
      local_278 = pSVar9;
      local_270 = pMVar10;
      local_268 = pMVar11;
    }
    else if (pSVar1 != (SparseMatrix<double,_0,_int> *)local_2a8) {
      Eigen::SparseMatrix<double,0,int>::initAssignment<Eigen::SparseMatrix<double,0,int>>
                ((SparseMatrix<double,0,int> *)pSVar1,(SparseMatrix<double,_0,_int> *)local_2a8);
      if ((_Impl *)local_288._0_8_ == (_Impl *)0x0) {
        sVar39 = (pPVar37->A).m_outerSize * 4 + 4;
        if (sVar39 != 0) {
          memcpy((pPVar37->A).m_outerIndex,(void *)local_298._8_8_,sVar39);
        }
        Eigen::internal::CompressedStorage<double,_int>::operator=
                  (&(pPVar37->A).m_data,(CompressedStorage<double,_int> *)(local_288 + 8));
      }
      else {
        Eigen::internal::
        assign_sparse_to_sparse<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>>
                  (pSVar1,(SparseMatrix<double,_0,_int> *)local_2a8);
      }
    }
    free((void *)local_298._8_8_);
    free((void *)local_288._0_8_);
    Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage
              ((CompressedStorage<double,_int> *)(local_288 + 8));
    uVar24 = local_7e0._0_8_;
    Eigen::internal::
    resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>,double,double>
              (&pPVar37->rhs,(Matrix<double,__1,_1,_0,__1,_1> *)&local_7e0,
               (assign_op<double,_double> *)local_2a8);
    pdVar12 = (pPVar37->rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    uVar40 = (pPVar37->rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
             .m_rows;
    uVar38 = uVar40 - ((long)uVar40 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar40) {
      lVar42 = 0;
      do {
        pdVar2 = (double *)(uVar24 + lVar42 * 8);
        dVar22 = pdVar2[1];
        pdVar3 = pdVar12 + lVar42;
        *pdVar3 = *pdVar2;
        pdVar3[1] = dVar22;
        lVar42 = lVar42 + 2;
      } while (lVar42 < (long)uVar38);
    }
    if ((long)uVar38 < (long)uVar40) {
      do {
        pdVar12[uVar38] = *(double *)(uVar24 + uVar38 * 8);
        uVar38 = uVar38 + 1;
      } while (uVar40 != uVar38);
    }
    Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
              ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
               local_2a8);
    Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::
    analyzePattern((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                   local_2a8,pSVar1);
    Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::factorize
              ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
               local_2a8,pSVar1);
    _local_4f8 = (DenseStorage<int,__1,__1,_1,_0>)
                 Eigen::
                 SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
                 ::solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                           ((SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
                             *)local_2a8,
                            (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_7e0);
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&pPVar37->solution,(SrcXprType *)local_4f8,
          (assign_op<double,_double> *)local_738._M_pod_data);
    pDVar5 = (pPVar37->dofh).
             super___shared_ptr<const_lf::assemble::DofHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_6c8._4_12_ = ZEXT412(0);
    local_6c8._0_4_ = 3;
    local_6b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                std::
                _Function_handler<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc:145:14)>
                ::_M_invoke;
    local_6b8 = std::
                _Function_handler<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc:145:14)>
                ::_M_manager;
    local_608._M_unused._M_object = (void *)0x0;
    local_608._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_5f0 = std::
                _Function_handler<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc:149:28)>
                ::_M_invoke;
    local_5f8 = std::
                _Function_handler<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/projects/ipdg_stokes/examples/manufactured_solution/manufactured_solution.cc:149:28)>
                ::_M_manager;
    lf::quad::make_QuadRule((QuadRule *)local_4f8,(RefEl)0x3,10);
    projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow
              ((tuple<lf::assemble::COOMatrix<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               &local_738,&pPVar37->mesh,pDVar5,
               (function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
                *)&local_6c8,
               (function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)> *)
               &local_608,1.0,(QuadRule *)local_4f8,true);
    free((void *)auStack_4d8._0_8_);
    free((void *)uStack_4f0);
    if (local_5f8 != (code *)0x0) {
      (*local_5f8)(&local_608,&local_608,3);
    }
    if (local_6b8 != (code *)0x0) {
      (*local_6b8)(&local_6c8,&local_6c8,3);
    }
    lf::assemble::COOMatrix<double>::makeSparse
              ((SparseMatrix<double,_0,_int> *)local_4f8,(COOMatrix<double> *)&local_728);
    pSVar1 = &pPVar37->A_modified;
    if (local_4f8[0] == true) {
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pPVar37->A_modified).m_outerIndex;
      (pPVar37->A_modified).m_outerIndex = (StorageIndex *)local_4e0;
      pcVar13 = (code *)(pPVar37->A_modified).m_innerSize;
      (pPVar37->A_modified).m_innerSize = (Index)local_4e8;
      pMVar44 = (Matrix<double,__1,_1,_0,__1,_1> *)(pPVar37->A_modified).m_outerSize;
      (pPVar37->A_modified).m_outerSize = uStack_4f0;
      uStack_4f0 = pMVar44;
      p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (pPVar37->A_modified).m_innerNonZeros;
      (pPVar37->A_modified).m_innerNonZeros = (StorageIndex *)auStack_4d8._0_8_;
      pSVar41 = (pPVar37->A_modified).m_data.m_values;
      (pPVar37->A_modified).m_data.m_values = (Scalar *)auStack_4d8._8_8_;
      pMVar15 = (pointer)(pPVar37->A_modified).m_data.m_indices;
      (pPVar37->A_modified).m_data.m_indices = (StorageIndex *)auStack_4d8._16_8_;
      pMVar16 = (pointer)(pPVar37->A_modified).m_data.m_size;
      (pPVar37->A_modified).m_data.m_size = auStack_4d8._24_8_;
      IVar17 = (pPVar37->A_modified).m_data.m_allocatedSize;
      (pPVar37->A_modified).m_data.m_allocatedSize = auStack_4d8._32_8_;
      local_4e8 = (undefined1  [8])pcVar13;
      local_4e0 = (code *)p_Var4;
      auStack_4d8._0_8_ = p_Var14;
      auStack_4d8._8_8_ = pSVar41;
      auStack_4d8._16_8_ = pMVar15;
      auStack_4d8._24_8_ = pMVar16;
      auStack_4d8._32_8_ = IVar17;
    }
    else if ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)pSVar1 !=
             (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)local_4f8
            ) {
      Eigen::SparseMatrix<double,0,int>::initAssignment<Eigen::SparseMatrix<double,0,int>>
                ((SparseMatrix<double,0,int> *)pSVar1,(SparseMatrix<double,_0,_int> *)local_4f8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_4d8._0_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        sVar39 = (pPVar37->A_modified).m_outerSize * 4 + 4;
        if (sVar39 != 0) {
          memcpy((pPVar37->A_modified).m_outerIndex,local_4e0,sVar39);
        }
        Eigen::internal::CompressedStorage<double,_int>::operator=
                  (&(pPVar37->A_modified).m_data,(CompressedStorage<double,_int> *)(auStack_4d8 + 8)
                  );
      }
      else {
        Eigen::internal::
        assign_sparse_to_sparse<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>>
                  (pSVar1,(SparseMatrix<double,_0,_int> *)local_4f8);
      }
    }
    free(local_4e0);
    free((void *)auStack_4d8._0_8_);
    Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage
              ((CompressedStorage<double,_int> *)(auStack_4d8 + 8));
    Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
              ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
               local_4f8,pSVar1);
    local_6c8 = (_Any_data)
                Eigen::
                SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
                ::solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                          ((SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
                            *)local_4f8,
                           (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                           local_738._M_pod_data);
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&pPVar37->solution_modified,(SrcXprType *)&local_6c8,
          (assign_op<double,_double> *)local_608._M_pod_data);
    Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
              ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
               local_4f8);
    if (local_720 != (pointer)0x0) {
      operator_delete(local_720,(long)local_710 - (long)local_720);
    }
    free(local_738._M_unused._M_object);
    Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
              ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
               local_2a8);
    if ((Matrix<double,__1,_1,_0,__1,_1> *)
        local_7e0.a_.grad_.dof_vector_.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
        (Matrix<double,__1,_1,_0,__1,_1> *)0x0) {
      operator_delete(local_7e0.a_.grad_.dof_vector_.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_data,(long)local_7e0.b_._vptr_MeshFunctionGlobal -
                             (long)local_7e0.a_.grad_.dof_vector_.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_data);
    }
    free((void *)local_7e0._0_8_);
    if (local_5d8.grad_.fe_space_.
        super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_5d8.grad_.fe_space_.
                 super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
    ::~_Rb_tree(&local_638);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_unsigned_int>_>_>_>
                 *)(local_670 + 8));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_670._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_670._0_8_);
    }
    if ((_Head_base<0UL,_lf::mesh::MeshFactory_*,_false>)local_690._16_8_ !=
        (_Head_base<0UL,_lf::mesh::MeshFactory_*,_false>)0x0) {
      (*(*(_func_int ***)local_690._16_8_)[7])();
    }
    local_690._16_8_ =
         (_Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)0x0
    ;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_690._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_690._8_8_);
    }
    std::filesystem::__cxx11::path::~path((path *)local_768);
    uVar31 = (int)local_7a0.
                  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1;
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_7a0.
                           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar31);
  } while (uVar31 < 6);
  local_7e4 = 0;
  do {
    local_5e8 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<lf::uscalfe::FeSpaceLagrangeO1<double>,std::allocator<lf::uscalfe::FeSpaceLagrangeO1<double>>,std::shared_ptr<lf::mesh::Mesh_const>&>
              (&local_5e0,(FeSpaceLagrangeO1<double> **)&local_5e8,
               (allocator<lf::uscalfe::FeSpaceLagrangeO1<double>_> *)local_2a8,
               &local_6e0.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
                _M_impl.super__Vector_impl_data._M_start[local_7e4].mesh);
    local_588._vptr_MeshFunctionGlobal = (_func_int **)&PTR__MeshFunctionGlobal_0049f100;
    local_588.f_.n = 3;
    local_558.
    super___shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_5e8;
    local_558.
    super___shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_5e0._M_pi;
    if (local_5e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_5e0._M_pi)->_M_use_count = (local_5e0._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_5e0._M_pi)->_M_use_count = (local_5e0._M_pi)->_M_use_count + 1;
      }
    }
    projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>::
    MeshFunctionVelocity
              ((MeshFunctionVelocity<double,_double> *)&local_608,&local_558,
               &local_6e0.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
                _M_impl.super__Vector_impl_data._M_start[local_7e4].solution);
    if (local_558.
        super___shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_558.
                 super___shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    local_568.
    super___shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_5e8;
    local_568.
    super___shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = local_5e0._M_pi;
    if (local_5e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_5e0._M_pi)->_M_use_count = (local_5e0._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_5e0._M_pi)->_M_use_count = (local_5e0._M_pi)->_M_use_count + 1;
      }
    }
    projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>::
    MeshFunctionVelocity
              (&local_5d8,&local_568,
               &local_6e0.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
                _M_impl.super__Vector_impl_data._M_start[local_7e4].solution_modified);
    if (local_568.
        super___shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_568.
                 super___shared_ptr<const_lf::uscalfe::UniformScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    local_578.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_6e0.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>._M_impl.
         super__Vector_impl_data._M_start[local_7e4].mesh.
         super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_578.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = local_6e0.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>._M_impl.
           super__Vector_impl_data._M_start[local_7e4].mesh.
           super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_578.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_578.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_578.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_578.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_578.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    concat<char_const(&)[7],unsigned_int&,char_const(&)[5]>
              (&local_518,(char (*) [7])"result",&local_7e4,(char (*) [5])".vtk");
    qr_selector_05 = (anon_class_1_0_00000001 *)0x1;
    lf::io::VtkWriter::VtkWriter((VtkWriter *)local_2a8,&local_578,&local_518,0,'\x01');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
    }
    if (local_578.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_578.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_6c8._M_unused._M_object =
         (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)&local_6b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"analyticU","");
    lf::io::VtkWriter::
    CheckAttributeSetName<std::vector<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>,std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>>>>
              ((VtkWriter *)local_2a8,local_1f8,(string *)&local_6c8);
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x50);
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_7a0.
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start + 5;
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start[4].
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start[4].
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start[3].
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start[3].
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start[2].
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start[2].
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start[1].
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start[1].
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    ((local_7a0.
      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data = (double *)0x0
    ;
    ((local_7a0.
      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0;
    local_788.m_storage.m_data._0_1_ = 2;
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_7a0.
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_738._M_unused._M_object = lf::base::RefEl::NodeCoords((RefEl *)&local_788);
    local_7e0._0_8_ = &DAT_4000000000000000;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)local_690,
                     (((MatrixXd *)local_738._M_unused._0_8_)->
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                     m_rows,1,(scalar_constant_op<double> *)&local_7e0);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)local_4f8,(Lhs *)&local_738,
                    (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)local_690,(scalar_quotient_op<double,_double> *)local_768);
    pMVar44 = local_7a0.
              super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 2;
    local_690._8_8_ = uStack_4f0;
    local_690._24_8_ = auStack_4d8._8_8_;
    Eigen::internal::
    resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::internal::member_sum<double,double>,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,double,double>
              (pMVar44,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_4f8,(assign_op<double,_double> *)&local_6f8);
    local_768._0_8_ =
         (pMVar44->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_7e0._0_8_ = local_768;
    local_7e0.a_.grad_.fe_space_.
    super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_690;
    local_7e0.a_.grad_.fe_space_.
    super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_6f8;
    local_7e0.a_.grad_.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_data = (double *)pMVar44;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)&local_7e0);
    local_788.m_storage.m_data._0_1_ = 3;
    local_738._M_unused._M_object = lf::base::RefEl::NodeCoords((RefEl *)&local_788);
    local_7e0._0_8_ = (pointer)0x4008000000000000;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)local_690,
                     (((MatrixXd *)local_738._M_unused._0_8_)->
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                     m_rows,1,(scalar_constant_op<double> *)&local_7e0);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)local_4f8,(Lhs *)&local_738,
                    (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)local_690,(scalar_quotient_op<double,_double> *)local_768);
    pMVar44 = local_7a0.
              super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 3;
    local_690._8_8_ = uStack_4f0;
    local_690._24_8_ = auStack_4d8._8_8_;
    Eigen::internal::
    resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::internal::member_sum<double,double>,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,double,double>
              (pMVar44,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_4f8,(assign_op<double,_double> *)&local_6f8);
    local_768._0_8_ =
         (pMVar44->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_7e0._0_8_ = local_768;
    local_7e0.a_.grad_.fe_space_.
    super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_690;
    local_7e0.a_.grad_.fe_space_.
    super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_6f8;
    local_7e0.a_.grad_.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_data = (double *)pMVar44;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)&local_7e0);
    local_788.m_storage.m_data = (double *)CONCAT71(local_788.m_storage.m_data._1_7_,3);
    local_738._M_unused._M_object = lf::base::RefEl::NodeCoords((RefEl *)&local_788);
    local_7e0._0_8_ = (pointer)0x4010000000000000;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)local_690,
                     (((MatrixXd *)local_738._M_unused._0_8_)->
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                     m_rows,1,(scalar_constant_op<double> *)&local_7e0);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)local_4f8,(Lhs *)&local_738,
                    (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)local_690,(scalar_quotient_op<double,_double> *)local_768);
    pMVar44 = local_7a0.
              super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 4;
    local_690._8_8_ = uStack_4f0;
    local_690._24_8_ = auStack_4d8._8_8_;
    Eigen::internal::
    resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::internal::member_sum<double,double>,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,double,double>
              (pMVar44,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_4f8,(assign_op<double,_double> *)&local_6f8);
    local_768._0_8_ =
         (pMVar44->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_7e0._0_8_ = local_768;
    local_7e0.a_.grad_.fe_space_.
    super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_690;
    local_7e0.a_.grad_.fe_space_.
    super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_6f8;
    local_7e0.a_.grad_.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_data = (double *)pMVar44;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)&local_7e0);
    local_690._0_8_ = local_690 + 0x10;
    local_690._16_8_ =
         (__uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>)0x0;
    local_690._24_8_ = (element_type *)0x0;
    local_690._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_660 = (pointer)0x0;
    local_670._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_670._8_8_ = (pointer)0x0;
    uVar31 = (**(code **)(*(long *)local_2a8 + 0x18))(local_2a8,(ulong)local_1c0);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::resize((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_670,(ulong)uVar31);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_690,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6c8);
    iVar32 = (**(code **)(*(long *)local_2a8 + 0x10))(local_2a8,(ulong)local_1c0);
    pp_Var34 = (_func_int **)CONCAT44(extraout_var,iVar32);
    if (extraout_RDX != 0) {
      local_7a8 = (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                  (pp_Var34 + extraout_RDX);
      do {
        p_Var18 = *pp_Var34;
        uVar31 = (**(code **)(*(long *)local_2a8 + 0x28))(local_2a8,p_Var18);
        pSVar41 = (Scalar *)((ulong)uVar31 * 0x18 + local_670._0_8_);
        bVar29 = (**(code **)(*(long *)p_Var18 + 0x20))(p_Var18);
        pMVar25 = local_7a0.
                  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_788.m_storage.m_data = (double *)0x0;
        local_788.m_storage.m_rows = 0;
        local_788.m_storage.m_cols = 0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                  (&local_788,
                   local_7a0.
                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[bVar29].
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,1
                  );
        pdVar12 = pMVar25[bVar29].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data;
        Eigen::internal::
        resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,double,double>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)&local_788,pMVar25 + bVar29,
                   (assign_op<double,_double> *)local_4f8);
        lVar42 = local_788.m_storage.m_cols * local_788.m_storage.m_rows;
        uVar40 = lVar42 - (lVar42 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < lVar42) {
          lVar43 = 0;
          do {
            pdVar2 = pdVar12 + lVar43;
            dVar22 = pdVar2[1];
            local_788.m_storage.m_data[lVar43] = *pdVar2;
            (local_788.m_storage.m_data + lVar43)[1] = dVar22;
            lVar43 = lVar43 + 2;
          } while (lVar43 < (long)uVar40);
        }
        if ((long)uVar40 < lVar42) {
          do {
            local_788.m_storage.m_data[uVar40] = pdVar12[uVar40];
            uVar40 = uVar40 + 1;
          } while (lVar42 - uVar40 != 0);
        }
        RVar30 = (**(code **)(*(long *)p_Var18 + 0x20))(p_Var18);
        dVar33 = lf::base::internal::DimensionImpl(RVar30);
        if (local_788.m_storage.m_rows != (ulong)dVar33) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_4f8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4e8,"mismatch between entity dimension and local.rows()",0x32)
          ;
          local_7e0._0_8_ =
               &local_7e0.a_.grad_.fe_space_.
                super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_7e0,"e.RefEl().Dimension() == local.rows()","");
          local_738._M_unused._M_object = &local_728;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_738,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
                     ,"");
          std::__cxx11::stringbuf::str();
          lf::base::AssertionFailed
                    ((string *)&local_7e0,(string *)&local_738,0x50,(string *)local_768);
          if ((undefined1 *)local_768._0_8_ != local_768 + 0x10) {
            operator_delete((void *)local_768._0_8_,CONCAT71(local_768._17_7_,local_768[0x10]) + 1);
          }
          if ((COOMatrix<double> *)local_738._M_unused._0_8_ != (COOMatrix<double> *)&local_728) {
            operator_delete(local_738._M_unused._M_object,
                            (ulong)((long)&local_728->_vptr__Sp_counted_base + 1));
          }
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_7e0._0_8_ !=
              &local_7e0.a_.grad_.fe_space_.
               super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount) {
            operator_delete((void *)local_7e0._0_8_,
                            (ulong)((long)local_7e0.a_.grad_.fe_space_.
                                          super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi + 1));
          }
          local_7e0._0_8_ =
               &local_7e0.a_.grad_.fe_space_.
                super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
          local_7e0.a_.grad_.fe_space_.
          super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._0_6_ = 0x65736c6166;
          local_7e0.a_.grad_.fe_space_.
          super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)0x5;
          local_738._M_unused._M_object = &local_728;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_738,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
                     ,"");
          local_768._8_8_ = (element_type *)0x0;
          local_768[0x10] = '\0';
          local_768._0_8_ = local_768 + 0x10;
          lf::base::AssertionFailed
                    ((string *)&local_7e0,(string *)&local_738,0x50,(string *)local_768);
          goto LAB_00119823;
        }
        local_6f8.
        super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_6f8.
        super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (Matrix<double,_2,_1,_0,_2,_1> *)0x0;
        local_6f8.
        super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (Matrix<double,_2,_1,_0,_2,_1> *)0x0;
        std::
        vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
        ::reserve(&local_6f8,local_788.m_storage.m_cols);
        plVar35 = (long *)(**(code **)(*(long *)p_Var18 + 0x18))(p_Var18);
        (**(code **)(*plVar35 + 0x18))
                  ((Matrix<double,__1,__1,_0,__1,__1> *)&local_7e0,plVar35,&local_788);
        if (0 < local_788.m_storage.m_cols) {
          lVar42 = 0;
          do {
            Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                      ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_4f8,
                       (Matrix<double,__1,__1,_0,__1,__1> *)&local_7e0,lVar42);
            Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::resize
                      (&local_5b8,uStack_4f0,1);
            auVar26 = local_4f8;
            Eigen::internal::
            resize_if_allowed<Eigen::Matrix<double,2,1,0,2,1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,double,double>
                      ((Matrix<double,_2,_1,_0,_2,_1> *)&local_5b8,
                       (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_4f8,
                       (assign_op<double,_double> *)local_738._M_pod_data);
            local_738._M_unused._0_8_ = (undefined8)*(undefined8 *)auVar26;
            local_738._8_8_ = *(undefined8 *)((long)auVar26 + 8);
            local_5b8.m_storage.m_data.array[0] = (double)local_738._M_unused._0_8_;
            local_5b8.m_storage.m_data.array[1] = (double)local_738._8_8_;
            computeU((int)local_768,(Vector2d *)0x3);
            if (local_6f8.
                super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_6f8.
                super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>
              ::_M_realloc_insert<Eigen::Matrix<double,2,1,0,2,1>>
                        ((vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>
                          *)&local_6f8,
                         (iterator)
                         local_6f8.
                         super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (Matrix<double,_2,_1,_0,_2,_1> *)local_768);
            }
            else {
              ((local_6f8.
                super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
              super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
              [0] = (double)local_768._0_8_;
              ((local_6f8.
                super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
              super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
              [1] = (double)local_768._8_8_;
              local_6f8.
              super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_6f8.
                   super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            lVar42 = lVar42 + 1;
          } while (lVar42 < local_788.m_storage.m_cols);
        }
        free((void *)local_7e0._0_8_);
        SVar23 = ((local_6f8.
                   super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
                 array[1];
        *pSVar41 = ((local_6f8.
                     super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
                   array[0];
        pSVar41[1] = SVar23;
        pSVar41[2] = 0.0;
        if (local_6f8.
            super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_6f8.
                          super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_6f8.
                                super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_6f8.
                                super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        free(local_788.m_storage.m_data);
        pp_Var34 = pp_Var34 + 1;
      } while ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
               pp_Var34 != local_7a8);
    }
    auVar26 = local_4f8;
    uStack_4f0 = &local_4e0;
    if ((element_type *)local_690._0_8_ == (element_type *)(local_690 + 0x10)) {
      auStack_4d8._0_8_ = local_690._24_8_;
    }
    else {
      uStack_4f0 = local_690._0_8_;
      _local_4f8 = (DenseStorage<int,__1,__1,_1,_0>)CONCAT88(uStack_4f0,auVar26);
    }
    local_4e0 = (code *)local_690._16_8_;
    local_4e8 = (undefined1  [8])local_690._8_8_;
    local_690._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_690._16_8_ = local_690._16_8_ & 0xffffffffffffff00;
    auStack_4d8._8_8_ = local_670._0_8_;
    auStack_4d8._16_8_ = local_670._8_8_;
    auStack_4d8._24_8_ = local_660;
    local_660 = (pointer)0x0;
    local_670._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_670._8_8_ = (pointer)0x0;
    local_4f8._0_4_ = 0xb;
    local_690._0_8_ = (element_type *)(local_690 + 0x10);
    std::
    vector<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>,std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>>>
    ::
    emplace_back<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>>
              ((vector<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>,std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>>>
                *)local_1f8,
               (variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>
                *)local_4f8);
    boost::
    variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>
    ::destroy_content((variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>
                       *)local_4f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_670._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      operator_delete((void *)local_670._0_8_,(long)local_660 - local_670._0_8_);
    }
    if ((element_type *)local_690._0_8_ != (element_type *)(local_690 + 0x10)) {
      operator_delete((void *)local_690._0_8_,(ulong)(local_690._16_8_ + 1));
    }
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::~vector(&local_7a0);
    if ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
        local_6c8._M_unused._0_8_ !=
        (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)&local_6b8) {
      operator_delete(local_6c8._M_unused._M_object,(ulong)(local_6b8 + 1));
    }
    local_6c8._M_unused._M_object =
         (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)&local_6b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"analyticF","");
    lf::io::VtkWriter::
    CheckAttributeSetName<std::vector<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>,std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>>>>
              ((VtkWriter *)local_2a8,local_1f8,(string *)&local_6c8);
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x50);
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_7a0.
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start + 5;
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start[4].
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start[4].
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start[3].
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start[3].
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start[2].
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start[2].
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start[1].
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start[1].
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    ((local_7a0.
      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data = (double *)0x0
    ;
    ((local_7a0.
      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0;
    local_788.m_storage.m_data._0_1_ = 2;
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_7a0.
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_738._M_unused._M_object = lf::base::RefEl::NodeCoords((RefEl *)&local_788);
    local_7e0._0_8_ = &DAT_4000000000000000;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)local_690,
                     (((MatrixXd *)local_738._M_unused._0_8_)->
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                     m_rows,1,(scalar_constant_op<double> *)&local_7e0);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)local_4f8,(Lhs *)&local_738,
                    (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)local_690,(scalar_quotient_op<double,_double> *)local_768);
    pMVar44 = local_7a0.
              super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 2;
    local_690._8_8_ = uStack_4f0;
    local_690._24_8_ = auStack_4d8._8_8_;
    Eigen::internal::
    resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::internal::member_sum<double,double>,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,double,double>
              (pMVar44,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_4f8,(assign_op<double,_double> *)&local_6f8);
    local_768._0_8_ =
         (pMVar44->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_7e0._0_8_ = local_768;
    local_7e0.a_.grad_.fe_space_.
    super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_690;
    local_7e0.a_.grad_.fe_space_.
    super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_6f8;
    local_7e0.a_.grad_.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_data = (double *)pMVar44;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)&local_7e0);
    local_788.m_storage.m_data._0_1_ = 3;
    local_738._M_unused._M_object = lf::base::RefEl::NodeCoords((RefEl *)&local_788);
    local_7e0._0_8_ = (pointer)0x4008000000000000;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)local_690,
                     (((MatrixXd *)local_738._M_unused._0_8_)->
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                     m_rows,1,(scalar_constant_op<double> *)&local_7e0);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)local_4f8,(Lhs *)&local_738,
                    (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)local_690,(scalar_quotient_op<double,_double> *)local_768);
    pMVar44 = local_7a0.
              super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 3;
    local_690._8_8_ = uStack_4f0;
    local_690._24_8_ = auStack_4d8._8_8_;
    Eigen::internal::
    resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::internal::member_sum<double,double>,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,double,double>
              (pMVar44,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_4f8,(assign_op<double,_double> *)&local_6f8);
    local_768._0_8_ =
         (pMVar44->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_7e0._0_8_ = local_768;
    local_7e0.a_.grad_.fe_space_.
    super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_690;
    local_7e0.a_.grad_.fe_space_.
    super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_6f8;
    local_7e0.a_.grad_.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_data = (double *)pMVar44;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)&local_7e0);
    local_788.m_storage.m_data = (double *)CONCAT71(local_788.m_storage.m_data._1_7_,3);
    local_738._M_unused._M_object = lf::base::RefEl::NodeCoords((RefEl *)&local_788);
    local_7e0._0_8_ = (pointer)0x4010000000000000;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)local_690,
                     (((MatrixXd *)local_738._M_unused._0_8_)->
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                     m_rows,1,(scalar_constant_op<double> *)&local_7e0);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)local_4f8,(Lhs *)&local_738,
                    (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)local_690,(scalar_quotient_op<double,_double> *)local_768);
    pMVar44 = local_7a0.
              super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 4;
    local_690._8_8_ = uStack_4f0;
    local_690._24_8_ = auStack_4d8._8_8_;
    Eigen::internal::
    resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::internal::member_sum<double,double>,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,double,double>
              (pMVar44,(CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        *)local_4f8,(assign_op<double,_double> *)&local_6f8);
    local_768._0_8_ =
         (pMVar44->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_7e0._0_8_ = local_768;
    local_7e0.a_.grad_.fe_space_.
    super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_690;
    local_7e0.a_.grad_.fe_space_.
    super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_6f8;
    local_7e0.a_.grad_.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_data = (double *)pMVar44;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)&local_7e0);
    local_690._0_8_ = local_690 + 0x10;
    local_690._16_8_ =
         (__uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>)0x0;
    local_690._24_8_ = (element_type *)0x0;
    local_690._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_660 = (pointer)0x0;
    local_670._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_670._8_8_ = (pointer)0x0;
    uVar31 = (**(code **)(*(long *)local_2a8 + 0x18))(local_2a8,(ulong)local_1c0);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::resize((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_670,(ulong)uVar31);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_690,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6c8);
    iVar32 = (**(code **)(*(long *)local_2a8 + 0x10))(local_2a8,(ulong)local_1c0);
    pp_Var34 = (_func_int **)CONCAT44(extraout_var_00,iVar32);
    if (extraout_RDX_00 != 0) {
      local_7a8 = (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                  (pp_Var34 + extraout_RDX_00);
      do {
        p_Var18 = *pp_Var34;
        uVar31 = (**(code **)(*(long *)local_2a8 + 0x28))(local_2a8,p_Var18);
        pSVar41 = (Scalar *)((ulong)uVar31 * 0x18 + local_670._0_8_);
        bVar29 = (**(code **)(*(long *)p_Var18 + 0x20))(p_Var18);
        pMVar25 = local_7a0.
                  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_788.m_storage.m_data = (double *)0x0;
        local_788.m_storage.m_rows = 0;
        local_788.m_storage.m_cols = 0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                  (&local_788,
                   local_7a0.
                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[bVar29].
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,1
                  );
        pdVar12 = pMVar25[bVar29].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data;
        Eigen::internal::
        resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,double,double>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)&local_788,pMVar25 + bVar29,
                   (assign_op<double,_double> *)local_4f8);
        lVar42 = local_788.m_storage.m_cols * local_788.m_storage.m_rows;
        uVar40 = lVar42 - (lVar42 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < lVar42) {
          lVar43 = 0;
          do {
            pdVar2 = pdVar12 + lVar43;
            dVar22 = pdVar2[1];
            local_788.m_storage.m_data[lVar43] = *pdVar2;
            (local_788.m_storage.m_data + lVar43)[1] = dVar22;
            lVar43 = lVar43 + 2;
          } while (lVar43 < (long)uVar40);
        }
        if ((long)uVar40 < lVar42) {
          do {
            local_788.m_storage.m_data[uVar40] = pdVar12[uVar40];
            uVar40 = uVar40 + 1;
          } while (lVar42 - uVar40 != 0);
        }
        RVar30 = (**(code **)(*(long *)p_Var18 + 0x20))(p_Var18);
        dVar33 = lf::base::internal::DimensionImpl(RVar30);
        if (local_788.m_storage.m_rows != (ulong)dVar33) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_4f8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4e8,"mismatch between entity dimension and local.rows()",0x32)
          ;
          local_7e0._0_8_ =
               &local_7e0.a_.grad_.fe_space_.
                super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_7e0,"e.RefEl().Dimension() == local.rows()","");
          local_738._M_unused._M_object = &local_728;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_738,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
                     ,"");
          std::__cxx11::stringbuf::str();
          lf::base::AssertionFailed
                    ((string *)&local_7e0,(string *)&local_738,0x50,(string *)local_768);
          if ((undefined1 *)local_768._0_8_ != local_768 + 0x10) {
            operator_delete((void *)local_768._0_8_,CONCAT71(local_768._17_7_,local_768[0x10]) + 1);
          }
          if ((COOMatrix<double> *)local_738._M_unused._0_8_ != (COOMatrix<double> *)&local_728) {
            operator_delete(local_738._M_unused._M_object,
                            (ulong)((long)&local_728->_vptr__Sp_counted_base + 1));
          }
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_7e0._0_8_ !=
              &local_7e0.a_.grad_.fe_space_.
               super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount) {
            operator_delete((void *)local_7e0._0_8_,
                            (ulong)((long)local_7e0.a_.grad_.fe_space_.
                                          super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi + 1));
          }
          local_7e0._0_8_ =
               &local_7e0.a_.grad_.fe_space_.
                super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
          local_7e0.a_.grad_.fe_space_.
          super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._0_6_ = 0x65736c6166;
          local_7e0.a_.grad_.fe_space_.
          super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)0x5;
          local_738._M_unused._M_object = &local_728;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_738,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/utils/mesh_function_global.h"
                     ,"");
          local_768._8_8_ = (element_type *)0x0;
          local_768[0x10] = '\0';
          local_768._0_8_ = local_768 + 0x10;
          lf::base::AssertionFailed
                    ((string *)&local_7e0,(string *)&local_738,0x50,(string *)local_768);
LAB_00119823:
          std::__cxx11::string::~string((string *)local_768);
          std::__cxx11::string::~string((string *)local_738._M_pod_data);
          std::__cxx11::string::~string((string *)&local_7e0);
          abort();
        }
        local_6f8.
        super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_6f8.
        super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (Matrix<double,_2,_1,_0,_2,_1> *)0x0;
        local_6f8.
        super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (Matrix<double,_2,_1,_0,_2,_1> *)0x0;
        std::
        vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
        ::reserve(&local_6f8,local_788.m_storage.m_cols);
        plVar35 = (long *)(**(code **)(*(long *)p_Var18 + 0x18))(p_Var18);
        (**(code **)(*plVar35 + 0x18))
                  ((Matrix<double,__1,__1,_0,__1,__1> *)&local_7e0,plVar35,&local_788);
        if (0 < local_788.m_storage.m_cols) {
          lVar42 = 0;
          do {
            Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                      ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_4f8,
                       (Matrix<double,__1,__1,_0,__1,__1> *)&local_7e0,lVar42);
            Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::resize
                      (&local_5b8,uStack_4f0,1);
            auVar26 = local_4f8;
            Eigen::internal::
            resize_if_allowed<Eigen::Matrix<double,2,1,0,2,1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,double,double>
                      ((Matrix<double,_2,_1,_0,_2,_1> *)&local_5b8,
                       (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_4f8,
                       (assign_op<double,_double> *)local_738._M_pod_data);
            local_738._M_unused._0_8_ = (undefined8)*(undefined8 *)auVar26;
            local_738._8_8_ = *(undefined8 *)((long)auVar26 + 8);
            local_5b8.m_storage.m_data.array[0] = (double)local_738._M_unused._0_8_;
            local_5b8.m_storage.m_data.array[1] = (double)local_738._8_8_;
            computeF((int)local_768,(Vector2d *)0x3);
            if (local_6f8.
                super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_6f8.
                super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>
              ::_M_realloc_insert<Eigen::Matrix<double,2,1,0,2,1>>
                        ((vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>
                          *)&local_6f8,
                         (iterator)
                         local_6f8.
                         super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (Matrix<double,_2,_1,_0,_2,_1> *)local_768);
            }
            else {
              ((local_6f8.
                super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
              super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
              [0] = (double)local_768._0_8_;
              ((local_6f8.
                super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
              super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
              [1] = (double)local_768._8_8_;
              local_6f8.
              super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_6f8.
                   super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            lVar42 = lVar42 + 1;
          } while (lVar42 < local_788.m_storage.m_cols);
        }
        free((void *)local_7e0._0_8_);
        SVar23 = ((local_6f8.
                   super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
                 array[1];
        *pSVar41 = ((local_6f8.
                     super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
                   array[0];
        pSVar41[1] = SVar23;
        pSVar41[2] = 0.0;
        if (local_6f8.
            super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_6f8.
                          super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_6f8.
                                super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_6f8.
                                super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        free(local_788.m_storage.m_data);
        pp_Var34 = pp_Var34 + 1;
      } while ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
               pp_Var34 != local_7a8);
    }
    auVar26 = local_4f8;
    uStack_4f0 = &local_4e0;
    if ((element_type *)local_690._0_8_ == (element_type *)(local_690 + 0x10)) {
      auStack_4d8._0_8_ = local_690._24_8_;
    }
    else {
      uStack_4f0 = local_690._0_8_;
      _local_4f8 = (DenseStorage<int,__1,__1,_1,_0>)CONCAT88(uStack_4f0,auVar26);
    }
    local_4e0 = (code *)local_690._16_8_;
    local_4e8 = (undefined1  [8])local_690._8_8_;
    local_690._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_690._16_8_ = local_690._16_8_ & 0xffffffffffffff00;
    auStack_4d8._8_8_ = local_670._0_8_;
    auStack_4d8._16_8_ = local_670._8_8_;
    auStack_4d8._24_8_ = local_660;
    local_660 = (pointer)0x0;
    local_670._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_670._8_8_ = (pointer)0x0;
    local_4f8._0_4_ = 0xb;
    local_690._0_8_ = (element_type *)(local_690 + 0x10);
    std::
    vector<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>,std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>>>
    ::
    emplace_back<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>>
              ((vector<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>,std::allocator<boost::variant<lf::io::VtkFile::ScalarData<char>,lf::io::VtkFile::ScalarData<unsigned_char>,lf::io::VtkFile::ScalarData<short>,lf::io::VtkFile::ScalarData<unsigned_short>,lf::io::VtkFile::ScalarData<int>,lf::io::VtkFile::ScalarData<unsigned_int>,lf::io::VtkFile::ScalarData<long>,lf::io::VtkFile::ScalarData<unsigned_long>,lf::io::VtkFile::ScalarData<float>,lf::io::VtkFile::ScalarData<double>,lf::io::VtkFile::VectorData<float>,lf::io::VtkFile::VectorData<double>>>>
                *)local_1f8,
               (variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>
                *)local_4f8);
    boost::
    variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>
    ::destroy_content((variant<lf::io::VtkFile::ScalarData<char>,_lf::io::VtkFile::ScalarData<unsigned_char>,_lf::io::VtkFile::ScalarData<short>,_lf::io::VtkFile::ScalarData<unsigned_short>,_lf::io::VtkFile::ScalarData<int>,_lf::io::VtkFile::ScalarData<unsigned_int>,_lf::io::VtkFile::ScalarData<long>,_lf::io::VtkFile::ScalarData<unsigned_long>,_lf::io::VtkFile::ScalarData<float>,_lf::io::VtkFile::ScalarData<double>,_lf::io::VtkFile::VectorData<float>,_lf::io::VtkFile::VectorData<double>_>
                       *)local_4f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_670._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      operator_delete((void *)local_670._0_8_,(long)local_660 - local_670._0_8_);
    }
    if ((element_type *)local_690._0_8_ != (element_type *)(local_690 + 0x10)) {
      operator_delete((void *)local_690._0_8_,(ulong)(local_690._16_8_ + 1));
    }
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::~vector(&local_7a0);
    if ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
        local_6c8._M_unused._0_8_ !=
        (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)&local_6b8) {
      operator_delete(local_6c8._M_unused._M_object,(ulong)(local_6b8 + 1));
    }
    local_4f8 = (undefined1  [8])local_4e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"U","");
    lf::io::VtkWriter::
    WriteCellData<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
              ((VtkWriter *)local_2a8,(string *)local_4f8,
               (MeshFunctionVelocity<double,_double> *)&local_608);
    if (local_4f8 != (undefined1  [8])local_4e8) {
      operator_delete((void *)local_4f8,(ulong)((long)local_4e8 + 1));
    }
    local_4f8 = (undefined1  [8])local_4e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"U_modified","");
    lf::io::VtkWriter::
    WriteCellData<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
              ((VtkWriter *)local_2a8,(string *)local_4f8,&local_5d8);
    if (local_4f8 != (undefined1  [8])local_4e8) {
      operator_delete((void *)local_4f8,(ulong)((long)local_4e8 + 1));
    }
    lf::mesh::utils::
    operator-<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
              (&local_7e0,(MeshFunctionVelocity<double,_double> *)&local_608,&local_588);
    lf::mesh::utils::
    operator-<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
              ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                *)&local_738,&local_5d8,&local_588);
    pMVar19 = (MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
               *)local_6e0.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
                 _M_impl.super__Vector_impl_data._M_start[local_7e4].mesh.
                 super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pPVar37 = local_6e0.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lf::mesh::utils::
    transpose<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
              ((MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
                *)local_690,(MeshFunctionVelocity<double,_double> *)&local_608);
    lf::mesh::utils::
    operator*<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
              ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                *)local_4f8,
               (MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
                *)local_690,&local_588);
    lf::fe::
    IntegrateMeshFunction<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:212:30),_lf::base::PredicateTrue>
              ((Mesh *)&local_6c8,pMVar19,(anon_class_1_0_00000001 *)local_4f8,
               (PredicateTrue *)pPVar37,(int)qr_selector_05);
    local_7a8 = (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                local_6c8._M_unused._0_8_;
    pMVar20 = local_6e0.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
              _M_impl.super__Vector_impl_data._M_start[local_7e4].mesh.
              super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pPVar37 = local_6e0.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lf::mesh::utils::
    squaredNorm<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
              ((MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
                *)local_768,(MeshFunctionVelocity<double,_double> *)&local_608);
    local_590 = lf::fe::
                IntegrateMeshFunction<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:212:30),_lf::base::PredicateTrue>
                          (pMVar20,(MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
                                    *)local_768,qr_selector,(PredicateTrue *)pPVar37,
                           (int)qr_selector_05);
    free((void *)local_768._24_8_);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_768._17_7_,local_768[0x10])
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT71(local_768._17_7_,local_768[0x10]));
    }
    free((void *)auStack_4d8._0_8_);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e0 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e0);
    }
    free((void *)local_690._24_8_);
    if ((_Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
        local_690._16_8_ != (MeshFactory *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_690._16_8_);
    }
    pMVar19 = (MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
               *)local_6e0.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
                 _M_impl.super__Vector_impl_data._M_start[local_7e4].mesh.
                 super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pPVar37 = local_6e0.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lf::mesh::utils::
    transpose<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
              ((MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
                *)local_690,&local_5d8);
    lf::mesh::utils::
    operator*<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
              ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                *)local_4f8,
               (MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
                *)local_690,&local_588);
    lf::fe::
    IntegrateMeshFunction<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpTranspose,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:212:30),_lf::base::PredicateTrue>
              ((Mesh *)&local_6c8,pMVar19,(anon_class_1_0_00000001 *)local_4f8,
               (PredicateTrue *)pPVar37,(int)qr_selector_05);
    local_598 = (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                local_6c8._M_unused._0_8_;
    pMVar20 = local_6e0.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
              _M_impl.super__Vector_impl_data._M_start[local_7e4].mesh.
              super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pPVar37 = local_6e0.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lf::mesh::utils::
    squaredNorm<projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
              ((MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
                *)local_768,&local_5d8);
    local_5a0 = lf::fe::
                IntegrateMeshFunction<lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:212:30),_lf::base::PredicateTrue>
                          (pMVar20,(MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpSquaredNorm,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
                                    *)local_768,qr_selector_00,(PredicateTrue *)pPVar37,
                           (int)qr_selector_05);
    free((void *)local_768._24_8_);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_768._17_7_,local_768[0x10])
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT71(local_768._17_7_,local_768[0x10]));
    }
    free((void *)auStack_4d8._0_8_);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e0 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4e0);
    }
    free((void *)local_690._24_8_);
    if ((_Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>)
        local_690._16_8_ != (MeshFactory *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_690._16_8_);
    }
    local_7a8 = (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                ((double)local_7a8 / local_590);
    poVar36 = std::ostream::_M_insert<double>((double)local_7a8);
    local_4f8[0] = true;
    std::__ostream_insert<char,std::char_traits<char>>(poVar36,(char *)local_4f8,1);
    local_4f8 = (undefined1  [8])local_7a8;
    lf::mesh::utils::
    operator*<lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
              ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
                *)local_768,(MeshFunctionConstant<double> *)local_4f8,
               (MeshFunctionVelocity<double,_double> *)&local_608);
    local_4f8 = (undefined1  [8])((double)local_598 / local_5a0);
    lf::mesh::utils::
    operator*<lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
              ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
                *)&local_6c8,(MeshFunctionConstant<double> *)local_4f8,&local_5d8);
    lf::mesh::utils::
    operator-<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
              ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                *)local_4f8,
               (MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
                *)local_768,&local_588);
    lf::mesh::utils::
    operator-<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
              ((MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                *)local_690,
               (MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>
                *)&local_6c8,&local_588);
    pPVar37 = local_6e0.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_7a8 = (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                projects::ipdg_stokes::post_processing::
                L2norm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>,lf::mesh::utils::MeshFunctionGlobal<main::__4>>,main::__6>
                          ((shared_ptr<const_lf::mesh::Mesh> *)
                           local_6e0.
                           super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
                           _M_impl.super__Vector_impl_data._M_start[local_7e4].mesh.
                           super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,&local_7e0,qr_selector_01);
    local_590 = projects::ipdg_stokes::post_processing::
                DGnorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>,lf::mesh::utils::MeshFunctionGlobal<main::__4>>,lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,lf::mesh::utils::MeshFunctionGlobal<main::__5>>,main::__6>
                          ((post_processing *)
                           (local_6e0.
                            super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
                            _M_impl.super__Vector_impl_data._M_start + local_7e4),
                           (shared_ptr<const_lf::mesh::Mesh> *)&local_7e0,
                           (MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                            *)0x3,(MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:190:9)>_>
                                   *)pPVar37,qr_selector_05);
    pPVar37 = local_6e0.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_598 = (SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)
                projects::ipdg_stokes::post_processing::
                L2norm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,lf::mesh::utils::MeshFunctionConstant<double>,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>>,lf::mesh::utils::MeshFunctionGlobal<main::__4>>,main::__6>
                          ((shared_ptr<const_lf::mesh::Mesh> *)
                           local_6e0.
                           super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
                           _M_impl.super__Vector_impl_data._M_start[local_7e4].mesh.
                           super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,(MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                                   *)local_4f8,qr_selector_02);
    local_5a0 = projects::ipdg_stokes::post_processing::
                DGnorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,lf::mesh::utils::MeshFunctionConstant<double>,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>>,lf::mesh::utils::MeshFunctionGlobal<main::__4>>,lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,lf::mesh::utils::MeshFunctionGlobal<main::__5>>,main::__6>
                          ((post_processing *)
                           (local_6e0.
                            super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
                            _M_impl.super__Vector_impl_data._M_start + local_7e4),
                           (shared_ptr<const_lf::mesh::Mesh> *)local_4f8,
                           (MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                            *)0x3,(MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:190:9)>_>
                                   *)pPVar37,qr_selector_05);
    pPVar37 = local_6e0.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_520 = projects::ipdg_stokes::post_processing::
                L2norm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>,lf::mesh::utils::MeshFunctionGlobal<main::__4>>,main::__6>
                          ((shared_ptr<const_lf::mesh::Mesh> *)
                           local_6e0.
                           super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
                           _M_impl.super__Vector_impl_data._M_start[local_7e4].mesh.
                           super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,(MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                                   *)&local_738,qr_selector_03);
    local_528 = projects::ipdg_stokes::post_processing::
                DGnorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>,lf::mesh::utils::MeshFunctionGlobal<main::__4>>,lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,lf::mesh::utils::MeshFunctionGlobal<main::__5>>,main::__6>
                          ((post_processing *)
                           (local_6e0.
                            super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
                            _M_impl.super__Vector_impl_data._M_start + local_7e4),
                           (shared_ptr<const_lf::mesh::Mesh> *)&local_738,
                           (MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                            *)0x3,(MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:190:9)>_>
                                   *)pPVar37,qr_selector_05);
    pPVar37 = local_6e0.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_530 = projects::ipdg_stokes::post_processing::
                L2norm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,lf::mesh::utils::MeshFunctionConstant<double>,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>>,lf::mesh::utils::MeshFunctionGlobal<main::__4>>,main::__6>
                          ((shared_ptr<const_lf::mesh::Mesh> *)
                           local_6e0.
                           super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
                           _M_impl.super__Vector_impl_data._M_start[local_7e4].mesh.
                           super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,(MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                                   *)local_690,qr_selector_04);
    local_538 = (int *)projects::ipdg_stokes::post_processing::
                       DGnorm<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,lf::mesh::utils::MeshFunctionConstant<double>,projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,double>>,lf::mesh::utils::MeshFunctionGlobal<main::__4>>,lf::mesh::utils::MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,lf::mesh::utils::MeshFunctionGlobal<main::__5>>,main::__6>
                                 ((post_processing *)
                                  (local_6e0.
                                   super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_7e4),
                                  (shared_ptr<const_lf::mesh::Mesh> *)local_690,
                                  (MeshFunctionBinary<lf::mesh::utils::internal::OperatorSubtraction,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionConstant<double>,_projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,_double>_>,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:188:9)>_>
                                   *)0x3,(MeshFunctionUnary<lf::mesh::utils::internal::UnaryOpMinus,_lf::mesh::utils::MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_projects_ipdg_stokes_examples_manufactured_solution_manufactured_solution_cc:190:9)>_>
                                          *)pPVar37,qr_selector_05);
    poVar36 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x20;
    poVar36 = std::__ostream_insert<char,std::char_traits<char>>(poVar36,(char *)&local_7a0,1);
    peVar21 = local_6e0.super__Vector_base<ProblemSolution,_std::allocator<ProblemSolution>_>.
              _M_impl.super__Vector_impl_data._M_start[local_7e4].mesh.
              super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar21->_vptr_Mesh[3])(peVar21,2);
    poVar36 = std::ostream::_M_insert<unsigned_long>((ulong)poVar36);
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar36,(char *)&local_7a0,1);
    poVar36 = std::ostream::_M_insert<double>((double)local_7a8);
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar36,(char *)&local_7a0,1);
    poVar36 = std::ostream::_M_insert<double>(local_590);
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar36,(char *)&local_7a0,1);
    poVar36 = std::ostream::_M_insert<double>((double)local_598);
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar36,(char *)&local_7a0,1);
    poVar36 = std::ostream::_M_insert<double>(local_5a0);
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar36,(char *)&local_7a0,1);
    poVar36 = std::ostream::_M_insert<double>(local_520);
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar36,(char *)&local_7a0,1);
    poVar36 = std::ostream::_M_insert<double>(local_528);
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar36,(char *)&local_7a0,1);
    poVar36 = std::ostream::_M_insert<double>(local_530);
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar36,(char *)&local_7a0,1);
    poVar36 = std::ostream::_M_insert<double>((double)local_538);
    local_7a0.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_7a0.
                           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar36,(char *)&local_7a0,1);
    free((void *)local_670._8_8_);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_670._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_670._0_8_);
    }
    free((void *)auStack_4d8._8_8_);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_4d8._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_4d8._0_8_);
    }
    free(local_6a8._M_p);
    if (local_6b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_6b0);
    }
    free(local_748);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_768._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_768._24_8_);
    }
    free(local_720);
    if (local_728 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_728);
    }
    free(local_7e0.a_.grad_.dof_vector_.
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    if (local_7e0.a_.grad_.fe_space_.
        super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_7e0.a_.grad_.fe_space_.
                 super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    lf::io::VtkWriter::~VtkWriter((VtkWriter *)local_2a8);
    free(local_5d8.grad_.dof_vector_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
         m_storage.m_data);
    if (local_5d8.grad_.fe_space_.
        super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_5d8.grad_.fe_space_.
                 super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    free(local_5f8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_608._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_608._8_8_);
    }
    if (local_5e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5e0._M_pi);
    }
    local_7e4 = local_7e4 + 1;
    if (5 < local_7e4) {
      std::vector<ProblemSolution,_std::allocator<ProblemSolution>_>::~vector(&local_6e0);
      return 0;
    }
  } while( true );
}

Assistant:

int main() {
  const unsigned mesh_count = 6;
  const int n = 3;
  const unsigned quadrule_degree = 10;

  // Compute the solution for each mesh
  std::vector<ProblemSolution> solutions(mesh_count);
  for (lf::base::size_type lvl = 0; lvl < mesh_count; ++lvl) {
    std::filesystem::path meshpath = __FILE__;
    meshpath = meshpath.parent_path() / concat("disk", lvl, ".msh");
    std::unique_ptr<lf::mesh::MeshFactory> factory =
        std::make_unique<lf::mesh::hybrid2d::MeshFactory>(2);
    lf::io::GmshReader reader(std::move(factory), meshpath.string());
    auto mesh = reader.mesh();
    auto& sol = solutions[lvl];
    sol.mesh = mesh;
    sol.dofh = std::shared_ptr<const lf::assemble::DofHandler>(
        new lf::assemble::UniformFEDofHandler(
            mesh, {{lf::base::RefEl::kPoint(), 1},
                   {lf::base::RefEl::kSegment(), 1}}));
    // Use the volume forces returned by computeF
    auto f = [n](const Eigen::Vector2d& x) -> Eigen::Vector2d {
      return computeF(n, x);
    };
    // The velocity on the boundary is zero everywhere
    auto dirichlet_funct = [](const lf::mesh::Entity&
                              /*unused*/) -> Eigen::Vector2d {
      return Eigen::Vector2d::Zero();
    };
    const auto [A, rhs] =
        projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(
            sol.mesh, *(sol.dofh), f, dirichlet_funct, 1,
            lf::quad::make_QuadRule(lf::base::RefEl::kTria(), quadrule_degree),
            false);
    sol.A = A.makeSparse();
    sol.rhs = rhs;
    Eigen::SparseLU<Eigen::SparseMatrix<double>> solver;
    solver.compute(sol.A);
    sol.solution = solver.solve(rhs);
    const auto [A_modified, rhs_modified] =
        projects::ipdg_stokes::assemble::buildSystemMatrixNoFlow(
            sol.mesh, *(sol.dofh), f, dirichlet_funct, 1,
            lf::quad::make_QuadRule(lf::base::RefEl::kTria(), quadrule_degree),
            true);
    sol.A_modified = A_modified.makeSparse();
    const Eigen::SparseLU<Eigen::SparseMatrix<double>> solver_modified(
        sol.A_modified);
    sol.solution_modified = solver_modified.solve(rhs_modified);
  }

  // Perform post processing on the data
  const auto analyticU = lf::mesh::utils::MeshFunctionGlobal(
      [&](const Eigen::Vector2d& x) -> Eigen::Vector2d {
        return computeU(n, x);
      });
  const auto analyticF = lf::mesh::utils::MeshFunctionGlobal(
      [&](const Eigen::Vector2d& x) -> Eigen::Vector2d {
        return computeF(n, x);
      });
  for (lf::base::size_type lvl = 0; lvl < mesh_count; ++lvl) {
    const auto fe_space =
        std::make_shared<lf::uscalfe::FeSpaceLagrangeO1<double>>(
            solutions[lvl].mesh);
    const auto velocity_exact = lf::mesh::utils::MeshFunctionGlobal(
        [n](const Eigen::Vector2d& x) { return computeU(n, x); });
    const auto grad_exact = lf::mesh::utils::MeshFunctionGlobal(
        [n](const Eigen::Vector2d& x) -> Eigen::Matrix2d {
          return computeUGrad(n, x);
        });
    const projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,
                                                                       double>
        velocity(fe_space, solutions[lvl].solution);
    const projects::ipdg_stokes::post_processing::MeshFunctionVelocity<double,
                                                                       double>
        velocity_modified(fe_space, solutions[lvl].solution_modified);
    lf::io::VtkWriter writer(solutions[lvl].mesh,
                             concat("result", lvl, ".vtk"));
    writer.WriteCellData("analyticU", analyticU);
    writer.WriteCellData("analyticF", analyticF);
    writer.WriteCellData("U", velocity);
    writer.WriteCellData("U_modified", velocity_modified);
    // The error in the velocity
    const auto diff_v = velocity - velocity_exact;
    const auto diff_v_modified = velocity_modified - velocity_exact;
    // The error in the gradient of the velocity
    const auto diff_grad = -grad_exact;
    const auto diff_grad_modified = -grad_exact;
    // Approximately compute the factor the numerical solution is off by
    const auto qr_provider = [](const lf::mesh::Entity& e) {
      return lf::quad::make_QuadRule(e.RefEl(), 0);
    };
    const double factor =
        lf::fe::IntegrateMeshFunction(
            *(solutions[lvl].mesh),
            lf::mesh::utils::transpose(velocity) * velocity_exact,
            qr_provider)(0, 0) /
        lf::fe::IntegrateMeshFunction(*(solutions[lvl].mesh),
                                      lf::mesh::utils::squaredNorm(velocity),
                                      qr_provider);
    const double factor_modified =
        lf::fe::IntegrateMeshFunction(
            *(solutions[lvl].mesh),
            lf::mesh::utils::transpose(velocity_modified) * velocity_exact,
            qr_provider)(0, 0) /
        lf::fe::IntegrateMeshFunction(
            *(solutions[lvl].mesh),
            lf::mesh::utils::squaredNorm(velocity_modified), qr_provider);
    std::cout << factor << '\n';
    // The error in the corrected velocity
    const auto velocity_scaled =
        lf::mesh::utils::MeshFunctionConstant<double>(factor) * velocity;
    const auto velocity_scaled_modified =
        lf::mesh::utils::MeshFunctionConstant(factor_modified) *
        velocity_modified;
    const auto diff_v_fac = velocity_scaled - velocity_exact;
    const auto diff_v_fac_modified = velocity_scaled_modified - velocity_exact;
    // The error in the gradient of the corrected velocty
    const auto& diff_g_fac = diff_grad;
    const auto& diff_g_fac_modified = diff_grad_modified;
    const double L2 = projects::ipdg_stokes::post_processing::L2norm(
        solutions[lvl].mesh, diff_v, qr_provider);
    const double DG = projects::ipdg_stokes::post_processing::DGnorm(
        solutions[lvl].mesh, diff_v, diff_grad, qr_provider);
    const double L2f = projects::ipdg_stokes::post_processing::L2norm(
        solutions[lvl].mesh, diff_v_fac, qr_provider);
    const double DGf = projects::ipdg_stokes::post_processing::DGnorm(
        solutions[lvl].mesh, diff_v_fac, diff_g_fac, qr_provider);
    const double L2_modified = projects::ipdg_stokes::post_processing::L2norm(
        solutions[lvl].mesh, diff_v_modified, qr_provider);
    const double DG_modified = projects::ipdg_stokes::post_processing::DGnorm(
        solutions[lvl].mesh, diff_v_modified, diff_grad_modified, qr_provider);
    const double L2f_modified = projects::ipdg_stokes::post_processing::L2norm(
        solutions[lvl].mesh, diff_v_fac_modified, qr_provider);
    const double DGf_modified = projects::ipdg_stokes::post_processing::DGnorm(
        solutions[lvl].mesh, diff_v_fac_modified, diff_g_fac_modified,
        qr_provider);
    std::cout << lvl << ' ' << solutions[lvl].mesh->NumEntities(2) << ' ' << L2
              << ' ' << DG << ' ' << L2f << ' ' << DGf << ' ' << L2_modified
              << ' ' << DG_modified << ' ' << L2f_modified << ' '
              << DGf_modified << '\n';
  }
}